

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O3

void __thiscall TimerManager::removeTimedEvent(TimerManager *this,Event *ev)

{
  ulong uVar1;
  AutoLock l;
  AutoLock local_30;
  
  AutoLock::AutoLock(&local_30,&this->mMutex);
  if ((this->mTimers).mSize != 0) {
    uVar1 = 0;
    do {
      Timer::removeTimedEvent((this->mTimers).mData[uVar1],ev);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->mTimers).mSize);
  }
  AutoLock::~AutoLock(&local_30);
  return;
}

Assistant:

void TimerManager::removeTimedEvent( Event *ev )
{
	TRACE_BEGIN(LOG_LVL_NOISE);

	// Lock mutex while accessing/modifying mTimers vector
	AutoLock l(mMutex);
	
	for (unsigned i = 0; i < mTimers.size(); ++i)
	{
		mTimers[i]->removeTimedEvent(ev);
	}
	
}